

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

StringPtr __thiscall capnp::Schema::getShortDisplayName(Schema *this)

{
  ulong uVar1;
  Reader RVar2;
  StringPtr SVar3;
  Reader proto;
  StructReader local_68;
  PointerReader local_38;
  
  local_38.pointer = (WirePointer *)this->raw->generic->encodedNode;
  local_38.segment = (SegmentReader *)0x0;
  local_38.capTable = (CapTableReader *)0x0;
  local_38.nestingLimit = 0x7fffffff;
  capnp::_::PointerReader::getStruct(&local_68,&local_38,(word *)0x0);
  if (local_68.pointerCount == 0) {
    local_68.nestingLimit = 0x7fffffff;
    local_68.pointers = (WirePointer *)0x0;
    local_68.segment = (SegmentReader *)0x0;
    local_68.capTable = (CapTableReader *)0x0;
  }
  uVar1 = 0;
  local_38.segment = local_68.segment;
  local_38.capTable = local_68.capTable;
  local_38.pointer = local_68.pointers;
  local_38.nestingLimit = local_68.nestingLimit;
  RVar2 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_38,(void *)0x0,0);
  if (0x5f < local_68.dataSize) {
    uVar1 = (ulong)*(uint *)((long)local_68.data + 8);
  }
  SVar3.content.ptr = RVar2.super_StringPtr.content.ptr + uVar1;
  SVar3.content.size_ = RVar2.super_StringPtr.content.size_ - uVar1;
  return (StringPtr)SVar3.content;
}

Assistant:

schema::Node::Reader Schema::getProto() const {
  return readMessageUnchecked<schema::Node>(raw->generic->encodedNode);
}